

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Extrapolation anon_unknown.dwarf_f6a4::getExtrapolation(string *str)

{
  bool bVar1;
  ostream *poVar2;
  invalid_argument *this;
  Extrapolation EVar3;
  string local_1c0 [32];
  stringstream e;
  ostream local_190 [376];
  
  bVar1 = std::operator==(str,"black");
  EVar3 = BLACK;
  if (!bVar1) {
    bVar1 = std::operator==(str,"BLACK");
    if (!bVar1) {
      bVar1 = std::operator==(str,"clamp");
      EVar3 = CLAMP;
      if (!bVar1) {
        bVar1 = std::operator==(str,"CLAMP");
        if (!bVar1) {
          bVar1 = std::operator==(str,"periodic");
          EVar3 = PERIODIC;
          if (!bVar1) {
            bVar1 = std::operator==(str,"PERIODIC");
            if (!bVar1) {
              bVar1 = std::operator==(str,"mirror");
              EVar3 = MIRROR;
              if (!bVar1) {
                bVar1 = std::operator==(str,"MIRROR");
                if (!bVar1) {
                  std::__cxx11::stringstream::stringstream((stringstream *)&e);
                  poVar2 = std::operator<<(local_190,"Unknown extrapolation method \"");
                  poVar2 = std::operator<<(poVar2,(string *)str);
                  std::operator<<(poVar2,"\"");
                  this = (invalid_argument *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::invalid_argument::invalid_argument(this,local_1c0);
                  __cxa_throw(this,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
              }
            }
          }
        }
      }
    }
  }
  return EVar3;
}

Assistant:

Extrapolation
getExtrapolation (const string& str)
{
    Extrapolation e;

    if (str == "black" || str == "BLACK") { e = BLACK; }
    else if (str == "clamp" || str == "CLAMP")
    {
        e = CLAMP;
    }
    else if (str == "periodic" || str == "PERIODIC")
    {
        e = PERIODIC;
    }
    else if (str == "mirror" || str == "MIRROR")
    {
        e = MIRROR;
    }
    else
    {
        std::stringstream e;
        e << "Unknown extrapolation method \"" << str << "\"";
        throw invalid_argument(e.str());
    }

    return e;
}